

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

int polymul::polynomial<double,_2,_10>::term_index(int *exponents)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  iVar4 = exponents[1] + *exponents;
  if (iVar4 == 0 || SCARRY4(exponents[1],*exponents) != iVar4 < 0) {
    iVar3 = 0;
  }
  else {
    iVar4 = iVar4 + -1;
    uVar6 = 0;
    iVar5 = -2;
    iVar3 = 0;
    do {
      iVar2 = 1;
      if (uVar6 < 2) {
        iVar7 = 1;
        do {
          iVar2 = ((iVar4 + iVar7) * iVar2) / iVar7;
          iVar1 = iVar5 + iVar7;
          iVar7 = iVar7 + 1;
        } while (iVar1 != 0);
      }
      iVar3 = iVar3 + iVar2;
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 - exponents[uVar6];
      uVar6 = uVar6 + 1;
    } while (-1 < iVar4);
  }
  return iVar3;
}

Assistant:

static int term_index(const int exponents[Nvar]) {
    int N = 0;
    for (int i = 0; i < Nvar; i++)
      N += exponents[i];
    int i = 0, idx = 0;
    N--;
    while (N >= 0) {
      idx += polylen(Nvar - i, N);
      N -= exponents[i];
      i++;
    }
    return idx;
  }